

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

int __thiscall re2::Prog::ComputeFirstByte(Prog *this)

{
  Inst *this_00;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  int *piVar5;
  int local_1cc;
  SparseSet q;
  LogMessageFatal local_1b0;
  
  SparseSet::SparseSet(&q,this->size_);
  SparseSet::insert(&q,this->start_);
  local_1cc = -1;
  for (piVar5 = q.dense_; piVar5 != q.dense_ + q.size_; piVar5 = piVar5 + 1) {
    iVar1 = *piVar5;
    this_00 = this->inst_ + iVar1;
    uVar4 = this_00->out_opcode_;
    iVar2 = local_1cc;
    switch(uVar4 & 7) {
    case 0:
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x291
                );
      poVar3 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"unhandled ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this_00->out_opcode_ & 7);
      std::operator<<(poVar3," in ComputeFirstByte");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
      break;
    case 1:
      if ((uVar4 & 8) != 0) {
        __assert_fail("!ip->last()",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                      0x2b8,"int re2::Prog::ComputeFirstByte()");
      }
      uVar4 = iVar1 + 1;
LAB_0012cbfa:
      SparseSet::insert(&q,uVar4);
      break;
    case 2:
      if ((uVar4 & 8) == 0) {
        SparseSet::insert(&q,iVar1 + 1);
      }
      iVar1 = Inst::lo(this_00);
      iVar2 = Inst::hi(this_00);
      if (((iVar1 != iVar2) ||
          (((iVar1 = Inst::foldcase(this_00), iVar1 != 0 &&
            (iVar1 = Inst::lo(this_00), 0x60 < iVar1)) && (iVar1 = Inst::lo(this_00), iVar1 < 0x7b))
          )) || ((iVar1 = Inst::lo(this_00), iVar2 = iVar1, local_1cc != -1 &&
                 (iVar2 = local_1cc, local_1cc != iVar1)))) goto switchD_0012cbc9_caseD_5;
      break;
    default:
      if ((uVar4 & 8) == 0) {
        SparseSet::insert(&q,iVar1 + 1);
        uVar4 = this_00->out_opcode_;
      }
      if (0xf < uVar4) {
        uVar4 = uVar4 >> 4;
        goto LAB_0012cbfa;
      }
      break;
    case 5:
switchD_0012cbc9_caseD_5:
      local_1cc = -1;
      goto LAB_0012cce9;
    case 7:
      break;
    }
    local_1cc = iVar2;
  }
LAB_0012cce9:
  SparseSet::~SparseSet(&q);
  return local_1cc;
}

Assistant:

int Prog::ComputeFirstByte() {
  int b = -1;
  SparseSet q(size());
  q.insert(start());
  for (SparseSet::iterator it = q.begin(); it != q.end(); ++it) {
    int id = *it;
    Prog::Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled " << ip->opcode() << " in ComputeFirstByte";
        break;

      case kInstMatch:
        // The empty string matches: no first byte.
        return -1;

      case kInstByteRange:
        if (!ip->last())
          q.insert(id+1);

        // Must match only a single byte
        if (ip->lo() != ip->hi())
          return -1;
        if (ip->foldcase() && 'a' <= ip->lo() && ip->lo() <= 'z')
          return -1;
        // If we haven't seen any bytes yet, record it;
        // otherwise must match the one we saw before.
        if (b == -1)
          b = ip->lo();
        else if (b != ip->lo())
          return -1;
        break;

      case kInstNop:
      case kInstCapture:
      case kInstEmptyWidth:
        if (!ip->last())
          q.insert(id+1);

        // Continue on.
        // Ignore ip->empty() flags for kInstEmptyWidth
        // in order to be as conservative as possible
        // (assume all possible empty-width flags are true).
        if (ip->out())
          q.insert(ip->out());
        break;

      case kInstAltMatch:
        DCHECK(!ip->last());
        q.insert(id+1);
        break;

      case kInstFail:
        break;
    }
  }
  return b;
}